

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_format_specs<wchar_t> *pbVar2;
  long lVar3;
  ulong uVar4;
  string groups;
  format_specs local_e8;
  string local_b8;
  ulong local_98;
  ulong uStack_90;
  wchar_t local_88 [2];
  wchar_t awStack_80 [4];
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_70;
  
  paVar1 = &local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_2_ = 3;
  local_b8._M_string_length = 1;
  pbVar2 = this->specs;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  if (pbVar2->thousands == '\0') {
    on_dec(this);
  }
  else {
    local_70.f.abs_value = this->abs_value;
    lVar3 = 0x3f;
    if ((local_70.f.abs_value | 1) != 0) {
      for (; (local_70.f.abs_value | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    local_70.f.size = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    local_70.f.size =
         (uint)(*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                          (ulong)(uint)local_70.f.size * 8) <= local_70.f.abs_value) +
         local_70.f.size;
    if (3 < (uint)local_70.f.size) {
      local_70.f.size = local_70.f.size + (int)(local_70.f.size - 4U) / 3 + 1;
    }
    local_70.prefix.size_ = (size_t)this->prefix_size;
    local_e8._32_8_ = *(undefined8 *)((pbVar2->fill).data_ + 5);
    local_e8.width = pbVar2->width;
    local_e8.precision = pbVar2->precision;
    uStack_90._0_1_ = pbVar2->type;
    uStack_90._1_3_ = *(undefined3 *)&pbVar2->field_0x9;
    uStack_90._4_4_ = (pbVar2->fill).data_[0];
    local_e8.fill.data_._4_8_ = *(undefined8 *)((pbVar2->fill).data_ + 1);
    local_e8.fill.data_._12_8_ = *(undefined8 *)((pbVar2->fill).data_ + 3);
    local_70.size_ = (uint)local_70.f.size + local_70.prefix.size_;
    local_e8._9_1_ = SUB31(uStack_90._1_3_,0);
    local_70.fill = uStack_90._4_4_;
    if ((local_e8._9_1_ & 0xf) == 4) {
      uVar4 = local_e8._0_8_ & 0xffffffff;
      local_70.padding = 0;
      if (local_70.size_ <= uVar4) {
        local_70.padding = uVar4 - local_70.size_;
        local_70.size_ = uVar4;
      }
    }
    else if (local_70.f.size < (int)local_e8.precision) {
      local_70.padding = (ulong)(uint)(local_e8.precision - local_70.f.size);
      local_70.size_ = (uint)local_e8.precision + local_70.prefix.size_;
      local_70.fill = L'0';
    }
    else {
      local_70.padding = 0;
    }
    local_70.prefix.data_ = this->prefix;
    local_e8._8_8_ = uStack_90;
    if ((uStack_90 & 0xf00) == 0) {
      local_e8._8_8_ = uStack_90 | 0x200;
    }
    local_70.f.groups = &local_b8;
    local_98 = local_e8._0_8_;
    local_88 = (wchar_t  [2])local_e8.fill.data_._4_8_;
    awStack_80._0_8_ = local_e8.fill.data_._12_8_;
    awStack_80._8_8_ = local_e8._32_8_;
    local_70.f.sep = (int)pbVar2->thousands;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_e8,
               &local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }